

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

string * fmt::v11::to_string<500ul>
                   (basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *buf)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  buffer<char> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t size;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  allocator<char> local_41;
  allocator<char> local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  buffer<char> *local_18;
  undefined1 local_1;
  
  __s = in_RDI;
  local_18 = in_RSI;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         detail::buffer<char>::size(in_RSI);
  __a = local_40;
  local_20 = this;
  std::__cxx11::string::string(this);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           max_size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x622359);
  local_1 = this < pbVar1;
  std::__cxx11::string::~string(in_RDI);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           detail::buffer<char>::data(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(pbVar1,(char *)__s,(size_type)this,__a);
  std::allocator<char>::~allocator(&local_41);
  return in_RDI;
}

Assistant:

FMT_NODISCARD auto to_string(const basic_memory_buffer<char, SIZE>& buf)
    -> std::string {
  auto size = buf.size();
  detail::assume(size < std::string().max_size());
  return {buf.data(), size};
}